

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5FindRankFunction(Fts5Cursor *pCsr)

{
  int iVar1;
  sqlite3_module *psVar2;
  sqlite3_value *psVar3;
  char *pcVar4;
  int local_5c;
  int i;
  sqlite3_int64 nByte;
  sqlite3_stmt *pStmt;
  char *zSql;
  char *zRankArgs;
  char *zRank;
  Fts5Auxiliary *pAux;
  undefined8 *puStack_20;
  int rc;
  Fts5Config *pConfig;
  Fts5FullTable *pTab;
  Fts5Cursor *pCsr_local;
  
  pConfig = (Fts5Config *)(pCsr->base).pVtab;
  puStack_20 = *(undefined8 **)&pConfig->nCol;
  pAux._4_4_ = 0;
  zRank = (char *)0x0;
  zRankArgs = pCsr->zRank;
  zSql = pCsr->zRankArgs;
  pTab = (Fts5FullTable *)pCsr;
  if ((zSql != (char *)0x0) &&
     (pStmt = (sqlite3_stmt *)sqlite3Fts5Mprintf((int *)((long)&pAux + 4),"SELECT %s",zSql),
     pStmt != (sqlite3_stmt *)0x0)) {
    nByte = 0;
    pAux._4_4_ = sqlite3_prepare_v3((sqlite3 *)*puStack_20,(char *)pStmt,-1,1,
                                    (sqlite3_stmt **)&nByte,(char **)0x0);
    sqlite3_free(pStmt);
    if (pAux._4_4_ == 0) {
      iVar1 = sqlite3_step((sqlite3_stmt *)nByte);
      if (iVar1 == 100) {
        iVar1 = sqlite3_column_count((sqlite3_stmt *)nByte);
        *(int *)&pTab[1].pSortCsr = iVar1;
        psVar2 = (sqlite3_module *)
                 sqlite3Fts5MallocZero
                           ((int *)((long)&pAux + 4),(long)*(int *)&pTab[1].pSortCsr << 3);
        pTab[2].p.base.pModule = psVar2;
        if (pAux._4_4_ == 0) {
          for (local_5c = 0; local_5c < *(int *)&pTab[1].pSortCsr; local_5c = local_5c + 1) {
            psVar3 = sqlite3_column_value((sqlite3_stmt *)nByte,local_5c);
            *(sqlite3_value **)(&(pTab[2].p.base.pModule)->iVersion + (long)local_5c * 2) = psVar3;
          }
        }
        *(sqlite3_int64 *)&pTab[2].p.base.nRef = nByte;
      }
      else {
        pAux._4_4_ = sqlite3_finalize((sqlite3_stmt *)nByte);
      }
    }
  }
  if ((pAux._4_4_ == 0) &&
     (zRank = (char *)fts5FindAuxiliary((Fts5FullTable *)pConfig,zRankArgs),
     (Fts5Auxiliary *)zRank == (Fts5Auxiliary *)0x0)) {
    pcVar4 = sqlite3_mprintf("no such function: %s",zRankArgs);
    pConfig->zName = pcVar4;
    pAux._4_4_ = 1;
  }
  pTab[1].pGlobal = (Fts5Global *)zRank;
  return pAux._4_4_;
}

Assistant:

static int fts5FindRankFunction(Fts5Cursor *pCsr){
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  int rc = SQLITE_OK;
  Fts5Auxiliary *pAux = 0;
  const char *zRank = pCsr->zRank;
  const char *zRankArgs = pCsr->zRankArgs;

  if( zRankArgs ){
    char *zSql = sqlite3Fts5Mprintf(&rc, "SELECT %s", zRankArgs);
    if( zSql ){
      sqlite3_stmt *pStmt = 0;
      rc = sqlite3_prepare_v3(pConfig->db, zSql, -1,
                              SQLITE_PREPARE_PERSISTENT, &pStmt, 0);
      sqlite3_free(zSql);
      assert( rc==SQLITE_OK || pCsr->pRankArgStmt==0 );
      if( rc==SQLITE_OK ){
        if( SQLITE_ROW==sqlite3_step(pStmt) ){
          sqlite3_int64 nByte;
          pCsr->nRankArg = sqlite3_column_count(pStmt);
          nByte = sizeof(sqlite3_value*)*pCsr->nRankArg;
          pCsr->apRankArg = (sqlite3_value**)sqlite3Fts5MallocZero(&rc, nByte);
          if( rc==SQLITE_OK ){
            int i;
            for(i=0; i<pCsr->nRankArg; i++){
              pCsr->apRankArg[i] = sqlite3_column_value(pStmt, i);
            }
          }
          pCsr->pRankArgStmt = pStmt;
        }else{
          rc = sqlite3_finalize(pStmt);
          assert( rc!=SQLITE_OK );
        }
      }
    }
  }

  if( rc==SQLITE_OK ){
    pAux = fts5FindAuxiliary(pTab, zRank);
    if( pAux==0 ){
      assert( pTab->p.base.zErrMsg==0 );
      pTab->p.base.zErrMsg = sqlite3_mprintf("no such function: %s", zRank);
      rc = SQLITE_ERROR;
    }
  }

  pCsr->pRank = pAux;
  return rc;
}